

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O2

void testMultiPartThreading(string *tempDir)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing the multi part APIs for multi-thread use")
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar1 = IlmThread_3_2::supportsThreads();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    random_reseed(1);
    IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::numThreads();
    iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
    anon_unknown.dwarf_1d7349::testWriteRead(1,1,5,tempDir);
    anon_unknown.dwarf_1d7349::testWriteRead(2,2,10,tempDir);
    anon_unknown.dwarf_1d7349::testWriteRead(5,5,0x19,tempDir);
    anon_unknown.dwarf_1d7349::testWriteRead(0x32,2,0xfa,tempDir);
    iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void
testMultiPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the multi part APIs for multi-thread use" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }
#if ILMTHREAD_THREADING_ENABLED
        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (32);

        testWriteRead (1, 1, 5, tempDir);
        testWriteRead (2, 2, 10, tempDir);
        testWriteRead (5, 5, 25, tempDir);
        testWriteRead (50, 2, 250, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}